

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFTokenizer.cc
# Opt level: O0

void __thiscall qpdf::Tokenizer::findEI(Tokenizer *this,InputSource *input)

{
  char ch_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  token_type_e tVar7;
  qpdf_offset_t offset;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  size_t sVar8;
  reference pcVar9;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_188;
  char ch;
  const_iterator __end6;
  const_iterator __begin6;
  string *__range6;
  bool found_other;
  bool found_non_printable;
  bool found_alpha;
  token_type_e typ;
  int local_140;
  byte local_139;
  int i;
  bool found_bad;
  Tokenizer check;
  int local_98;
  allocator<char> local_81;
  string local_80;
  undefined1 local_60 [8];
  QPDFWordTokenFinder f;
  bool first_try;
  bool okay;
  qpdf_offset_t pos;
  qpdf_offset_t last_offset;
  InputSource *input_local;
  Tokenizer *this_local;
  
  offset = InputSource::getLastOffset(input);
  iVar5 = (*input->_vptr_InputSource[4])();
  f.str.field_2._M_local_buf[0xf] = '\0';
  f.str.field_2._M_local_buf[0xe] = '\x01';
  do {
    if (((f.str.field_2._M_local_buf[0xf] ^ 0xffU) & 1) == 0) break;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"EI",&local_81);
    anon_unknown.dwarf_4592d2::QPDFWordTokenFinder::QPDFWordTokenFinder
              ((QPDFWordTokenFinder *)local_60,input,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    iVar6 = (*input->_vptr_InputSource[4])();
    bVar3 = InputSource::findFirst(input,"EI",CONCAT44(extraout_var_00,iVar6),0,(Finder *)local_60);
    if (bVar3) {
      iVar6 = (*input->_vptr_InputSource[4])();
      check._144_8_ = (CONCAT44(extraout_var_01,iVar6) - CONCAT44(extraout_var,iVar5)) + -2;
      sVar8 = QIntC::to_size<long_long>((longlong *)&check.digit_count);
      this->inline_image_bytes = sVar8;
      Tokenizer((Tokenizer *)&i);
      local_139 = 0;
      for (local_140 = 0; local_140 < 10; local_140 = local_140 + 1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&typ,"checker",(allocator<char> *)&found_alpha);
        nextToken((Tokenizer *)&i,input,(string *)&typ,0);
        std::__cxx11::string::~string((string *)&typ);
        std::allocator<char>::~allocator((allocator<char> *)&found_alpha);
        tVar7 = getType((Tokenizer *)&i);
        if (tVar7 == tt_eof) {
          f.str.field_2._M_local_buf[0xf] = '\x01';
        }
        else if (tVar7 == tt_bad) {
          local_139 = 1;
        }
        else if (tVar7 == tt_word) {
          bVar1 = false;
          bVar3 = false;
          bVar2 = false;
          getValue_abi_cxx11_((Tokenizer *)&i);
          __end6._M_current = (char *)std::__cxx11::string::begin();
          _Stack_188._M_current = (char *)std::__cxx11::string::end();
          while (bVar4 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffe78), bVar4) {
            pcVar9 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&__end6);
            ch_00 = *pcVar9;
            if ((((ch_00 < 'a') || ('z' < ch_00)) && ((ch_00 < 'A' || ('Z' < ch_00)))) &&
               (ch_00 != '*')) {
              if ((ch_00 < ' ') && (bVar4 = isSpace(this,ch_00), !bVar4)) {
                bVar3 = true;
                break;
              }
              bVar2 = true;
            }
            else {
              bVar1 = true;
            }
            __gnu_cxx::
            __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator++(&__end6);
          }
          if ((bVar3) || ((bVar1 && (bVar2)))) {
            local_139 = 1;
          }
        }
        if (((f.str.field_2._M_local_buf[0xf] & 1U) != 0) || ((local_139 & 1) != 0)) break;
      }
      if ((local_139 & 1) == 0) {
        f.str.field_2._M_local_buf[0xf] = '\x01';
      }
      if ((f.str.field_2._M_local_buf[0xf] & 1U) == 0) {
        f.str.field_2._M_local_buf[0xe] = '\0';
      }
      ~Tokenizer((Tokenizer *)&i);
      local_98 = 0;
    }
    else {
      local_98 = 3;
    }
    anon_unknown.dwarf_4592d2::QPDFWordTokenFinder::~QPDFWordTokenFinder
              ((QPDFWordTokenFinder *)local_60);
  } while (local_98 == 0);
  if (((f.str.field_2._M_local_buf[0xf] & 1U) != 0) && ((f.str.field_2._M_local_buf[0xe] & 1U) == 0)
     ) {
    QTC::TC("qpdf","QPDFTokenizer found EI after more than one try",0);
  }
  (*input->_vptr_InputSource[5])(input,CONCAT44(extraout_var,iVar5),0);
  InputSource::setLastOffset(input,offset);
  return;
}

Assistant:

void
Tokenizer::findEI(InputSource& input)
{
    qpdf_offset_t last_offset = input.getLastOffset();
    qpdf_offset_t pos = input.tell();

    // Use QPDFWordTokenFinder to find EI surrounded by delimiters. Then read the next several
    // tokens or up to EOF. If we find any suspicious-looking or tokens, this is probably still part
    // of the image data, so keep looking for EI. Stop at the first EI that passes. If we get to the
    // end without finding one, return the last EI we found. Store the number of bytes expected in
    // the inline image including the EI and use that to break out of inline image, falling back to
    // the old method if needed.

    bool okay = false;
    bool first_try = true;
    while (!okay) {
        QPDFWordTokenFinder f(input, "EI");
        if (!input.findFirst("EI", input.tell(), 0, f)) {
            break;
        }
        inline_image_bytes = QIntC::to_size(input.tell() - pos - 2);

        Tokenizer check;
        bool found_bad = false;
        // Look at the next 10 tokens or up to EOF. The next inline image's image data would look
        // like bad tokens, but there will always be at least 10 tokens between one inline image's
        // EI and the next valid one's ID since width, height, bits per pixel, and color space are
        // all required as well as a BI and ID. If we get 10 good tokens in a row or hit EOF, we can
        // be pretty sure we've found the actual EI.
        for (int i = 0; i < 10; ++i) {
            check.nextToken(input, "checker");
            auto typ = check.getType();
            if (typ == tt::tt_eof) {
                okay = true;
            } else if (typ == tt::tt_bad) {
                found_bad = true;
            } else if (typ == tt::tt_word) {
                // The qpdf tokenizer lumps alphabetic and otherwise uncategorized characters into
                // "words". We recognize strings of alphabetic characters as potential valid
                // operators for purposes of telling whether we're in valid content or not. It's not
                // perfect, but it should work more reliably than what we used to do, which was
                // already good enough for the vast majority of files.
                bool found_alpha = false;
                bool found_non_printable = false;
                bool found_other = false;
                for (char ch: check.getValue()) {
                    if ((ch >= 'a' && ch <= 'z') || (ch >= 'A' && ch <= 'Z') || (ch == '*')) {
                        // Treat '*' as alpha since there are valid PDF operators that contain *
                        // along with alphabetic characters.
                        found_alpha = true;
                    } else if (static_cast<signed char>(ch) < 32 && !isSpace(ch)) {
                        // Compare ch as a signed char so characters outside of 7-bit will be < 0.
                        found_non_printable = true;
                        break;
                    } else {
                        found_other = true;
                    }
                }
                if (found_non_printable || (found_alpha && found_other)) {
                    found_bad = true;
                }
            }
            if (okay || found_bad) {
                break;
            }
        }
        if (!found_bad) {
            okay = true;
        }
        if (!okay) {
            first_try = false;
        }
    }
    if (okay && (!first_try)) {
        QTC::TC("qpdf", "QPDFTokenizer found EI after more than one try");
    }

    input.seek(pos, SEEK_SET);
    input.setLastOffset(last_offset);
}